

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.hh
# Opt level: O2

void __thiscall tinyusdz::crate::CrateReader::Node::Node(Node *this,int64_t parent,Path *path)

{
  this->_parent = parent;
  (this->_children).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_children).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_children).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_primChildren)._M_h._M_buckets = &(this->_primChildren)._M_h._M_single_bucket;
  (this->_primChildren)._M_h._M_bucket_count = 1;
  (this->_primChildren)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_primChildren)._M_h._M_element_count = 0;
  (this->_primChildren)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_primChildren)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_primChildren)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Path::Path(&this->_path,path);
  Path::Path(&this->_elemPath);
  return;
}

Assistant:

Node(int64_t parent, Path &path) : _parent(parent), _path(path) {}